

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

Gia_Man_t * Gia_ManDupNoMuxes(Gia_Man_t *p,int fSkipBufs)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  uint *puVar7;
  uint uVar8;
  int iVar9;
  Gia_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  Gia_Man_t *pGVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  
  if ((p->pMuxes == (uint *)0x0) && (p->nXors == 0)) {
    __assert_fail("p->pMuxes != NULL || Gia_ManXorNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xa6,"Gia_Man_t *Gia_ManDupNoMuxes(Gia_Man_t *, int)");
  }
  p_00 = Gia_ManStart(5000);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar3);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar3);
  }
  p_00->pName = pcVar11;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar3);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar3);
  }
  p_00->pSpec = pcVar11;
  p->pObjs->Value = 0;
  Gia_ManHashStart(p_00);
  uVar15 = (ulong)(uint)p->nObjs;
  if (1 < p->nObjs) {
    lVar18 = 1;
    lVar19 = 5;
    do {
      pGVar4 = p->pObjs;
      uVar5 = *(ulong *)((long)pGVar4 + lVar19 * 4 + -8);
      uVar17 = (uint)uVar5;
      if ((uVar17 & 0x9fffffff) == 0x9fffffff) {
        pGVar12 = Gia_ManAppendObj(p_00);
        uVar15 = *(ulong *)pGVar12;
        *(ulong *)pGVar12 = uVar15 | 0x9fffffff;
        *(ulong *)pGVar12 =
             uVar15 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar6 = p_00->pObjs;
        if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) {
LAB_0021d671:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * -0x55555555);
        pGVar6 = p_00->pObjs;
        if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) goto LAB_0021d671;
        uVar8 = (int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * 0x55555556;
      }
      else {
        uVar13 = uVar5 & 0x1fffffff;
        iVar9 = (int)uVar13;
        if (uVar13 == 0x1fffffff || -1 < (int)uVar17) {
          uVar16 = uVar17 & 0x1fffffff;
          uVar8 = (uint)(uVar5 >> 0x20);
          if ((((int)uVar17 < 0) || (uVar16 == 0x1fffffff)) || (uVar16 != (uVar8 & 0x1fffffff))) {
            puVar7 = p->pMuxes;
            if ((puVar7 == (uint *)0x0) || (puVar7[lVar18] == 0)) {
              uVar1 = *(uint *)((long)pGVar4 + lVar19 * 4 + (ulong)(uint)(iVar9 << 2) * -3);
              if ((uVar13 == 0x1fffffff || (int)uVar17 < 0) || (uVar8 & 0x1fffffff) <= uVar16) {
                if (((int)uVar1 < 0) ||
                   (uVar17 = *(uint *)((long)pGVar4 +
                                      lVar19 * 4 + (ulong)((uVar8 & 0x1fffffff) << 2) * -3),
                   (int)uVar17 < 0)) goto LAB_0021d690;
                uVar8 = Gia_ManHashAnd(p_00,uVar1 ^ (uint)(uVar5 >> 0x1d) & 1,
                                       uVar17 ^ uVar8 >> 0x1d & 1);
              }
              else {
                if (((int)uVar1 < 0) ||
                   (uVar17 = *(uint *)((long)pGVar4 +
                                      lVar19 * 4 + (ulong)((uVar8 & 0x1fffffff) << 2) * -3),
                   (int)uVar17 < 0)) goto LAB_0021d690;
                uVar8 = Gia_ManHashXor(p_00,uVar1 ^ (uint)(uVar5 >> 0x1d) & 1,
                                       uVar17 ^ uVar8 >> 0x1d & 1);
              }
            }
            else {
              uVar16 = puVar7[lVar18];
              if ((int)uVar16 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              if ((uint)uVar15 <= uVar16 >> 1) {
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              if ((((int)pGVar4[uVar16 >> 1].Value < 0) ||
                  (uVar1 = *(uint *)((long)pGVar4 +
                                    lVar19 * 4 + (ulong)((uVar8 & 0x1fffffff) << 2) * -3),
                  (int)uVar1 < 0)) ||
                 (uVar2 = *(uint *)((long)pGVar4 + lVar19 * 4 + (ulong)(uint)(iVar9 << 2) * -3),
                 (int)uVar2 < 0)) goto LAB_0021d690;
              uVar8 = Gia_ManHashMux(p_00,pGVar4[uVar16 >> 1].Value ^ uVar16 & 1,
                                     uVar1 ^ uVar8 >> 0x1d & 1,uVar2 ^ uVar17 >> 0x1d & 1);
            }
          }
          else {
            uVar8 = *(uint *)((long)pGVar4 + lVar19 * 4 + (ulong)(uint)(iVar9 << 2) * -3);
            if (fSkipBufs == 0) {
              if ((int)uVar8 < 0) goto LAB_0021d690;
              uVar8 = Gia_ManAppendBuf(p_00,uVar8 ^ uVar17 >> 0x1d & 1);
            }
            else {
              if ((int)uVar8 < 0) {
LAB_0021d690:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              uVar8 = uVar8 ^ uVar17 >> 0x1d & 1;
            }
          }
        }
        else {
          uVar8 = *(uint *)((long)pGVar4 + lVar19 * 4 + (ulong)(uint)(iVar9 << 2) * -3);
          if ((int)uVar8 < 0) goto LAB_0021d690;
          uVar8 = Gia_ManAppendCo(p_00,uVar8 ^ uVar17 >> 0x1d & 1);
        }
      }
      *(uint *)(&pGVar4->field_0x0 + lVar19 * 4) = uVar8;
      lVar18 = lVar18 + 1;
      uVar15 = (ulong)p->nObjs;
      lVar19 = lVar19 + 3;
    } while (lVar18 < (long)uVar15);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar14 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar14;
}

Assistant:

Gia_Man_t * Gia_ManDupNoMuxes( Gia_Man_t * p, int fSkipBufs )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pMuxes != NULL || Gia_ManXorNum(p) );
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashStart( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = fSkipBufs ? Gia_ObjFanin0Copy(pObj) : Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsMuxId(p, i) )
            pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}